

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O3

value * json::parse(string *input)

{
  bool bVar1;
  int iVar2;
  object *poVar3;
  string *psVar4;
  size_type sVar5;
  Pig n;
  Pig local_60;
  string local_40;
  
  Pig::Pig(&local_60,input);
  Pig::skipWS(&local_60);
  iVar2 = Pig::peek(&local_60);
  if (iVar2 == 0x7b) {
    poVar3 = object::parse(&local_60);
  }
  else {
    iVar2 = Pig::peek(&local_60);
    if (iVar2 != 0x5b) {
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Error: expected \'{\' or \'[\' at position {1}","");
      sVar5 = Pig::cursor(&local_60);
      format<int>(psVar4,1,&local_40,(int)sVar5);
      __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    poVar3 = (object *)array::parse(&local_60);
  }
  Pig::skipWS(&local_60);
  bVar1 = Pig::eos(&local_60);
  if (bVar1) {
    if (local_60._text.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60._text.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return &poVar3->super_value;
  }
  if (poVar3 != (object *)0x0) {
    (*(poVar3->super_value)._vptr_value[1])(poVar3);
  }
  psVar4 = (string *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Error: extra characters found at position {1}","");
  sVar5 = Pig::cursor(&local_60);
  format<int>(psVar4,1,&local_40,(int)sVar5);
  __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

json::value* json::parse (const std::string& input)
{
  json::value* root = nullptr;

  Pig n (input);
  n.skipWS ();

       if (n.peek () == '{') root = json::object::parse (n);
  else if (n.peek () == '[') root = json::array::parse (n);
  else
    throw format ("Error: expected '{' or '[' at position {1}", (int) n.cursor ());

  // Check for end condition.
  n.skipWS ();
  if (!n.eos ())
  {
    delete root;
    throw format ("Error: extra characters found at position {1}", (int) n.cursor ());
  }

  return root;
}